

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_add_inplace(m256v *A,m256v *B_inout)

{
  int r;
  int r1;
  
  for (r1 = 0; r1 < B_inout->n_row; r1 = r1 + 1) {
    m256v_multadd_row(A,r1,'\x01',B_inout,r1);
  }
  return;
}

Assistant:

void MV_GEN_N(_add_inplace)(const MV_GEN_TYPE* A, MV_GEN_TYPE* B_inout)
{
	assert(A->n_row == B_inout->n_row);
	assert(A->n_col == B_inout->n_col);

	for (int r = 0; r < B_inout->n_row; ++r) {
		MV_GEN_N(_multadd_row)(A, r, 1, B_inout, r);
	}
}